

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
deleteContents(PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>
               *this)

{
  long *plVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->_numEntries != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      if ((*(long *)((long)&(this->_entries->key)._val + lVar4) != 0) &&
         (plVar1 = *(long **)((long)&(this->_entries->key)._val + lVar4), plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < this->_numEntries);
  }
  if (this->_entries != (Entry *)0x0) {
    operator_delete__(this->_entries);
  }
  ppEVar3 = (this->_oldEntries).
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (this->_oldEntries).
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar3) {
    uVar5 = 0;
    do {
      if (ppEVar3[uVar5] != (Entry *)0x0) {
        operator_delete__(ppEVar3[uVar5]);
        ppEVar3 = (this->_oldEntries).
                  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 = (this->_oldEntries).
                  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)ppEVar2 - (long)ppEVar3 >> 3));
  }
  ppEVar2 = (this->_oldEntries).
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppEVar3 != (pointer)0x0) {
    operator_delete(ppEVar3,(long)ppEVar2 - (long)ppEVar3);
    return;
  }
  return;
}

Assistant:

void deleteContents()
    {
        for (uint32_t i = 0; i < _numEntries; ++i) {
            if (_entries[i].value) delete _entries[i].value;
        }
        delete [] _entries;
        for (size_t i = 0; i < _oldEntries.size(); ++i) {
            delete [] _oldEntries[i];
        }
        std::vector<Entry*>().swap(_oldEntries);
    }